

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_compute_shader_code)

{
  samplingFunction sampling_function_00;
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  attributeDefinition *paVar5;
  TextureCubeMapArraySamplingTest *this_00;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool is_shadow_sampler;
  GLuint n_components;
  GLchar *sampler_type_str;
  GLchar *image_layout_str;
  GLchar *image_type_str;
  GLchar *interpolation_type;
  GLchar *color_type;
  string sampling_code;
  stringstream stream;
  bool local_245;
  GLuint local_244;
  samplerType local_240;
  GLuint local_23c;
  samplerType *local_238;
  GLchar *local_230;
  GLchar *local_228;
  GLchar *local_220;
  string *local_218;
  char *local_210;
  GLchar *local_208;
  GLchar *local_200;
  string local_1f8;
  undefined1 local_1d8 [392];
  string local_50 [32];
  
  local_200 = (GLchar *)0x0;
  local_220 = (char *)0x0;
  local_228 = (char *)0x0;
  local_208 = (GLchar *)0x0;
  local_23c = 0;
  local_230 = (char *)0x0;
  local_245 = false;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  this_00 = (TextureCubeMapArraySamplingTest *)local_1d8;
  local_238 = sampler_type;
  local_218 = out_compute_shader_code;
  std::__cxx11::stringstream::stringstream((stringstream *)this_00);
  sampling_function_00 = *sampling_function;
  uVar2 = (ulong)sampling_function_00;
  lVar9 = 0;
  puVar6 = (undefined8 *)0x0;
  if (uVar2 < 4) {
    lVar9 = *(long *)(&DAT_017c67d8 + uVar2 * 8);
    puVar6 = (undefined8 *)(&PTR_texture_attributes_01dfc838)[uVar2];
  }
  local_240 = *local_238;
  paVar5 = (attributeDefinition *)0x0;
  if (local_240 == Depth) {
    paVar5 = getAttributes::depth_attributes;
  }
  getColorType(this_00,local_240,&local_200,&local_208,&local_230,&local_220,&local_228,&local_23c,
               &local_245);
  local_244 = local_23c;
  local_210 = local_200;
  if (local_245 == false) {
    getSamplingFunctionCall
              (this_00,sampling_function_00,local_200,local_23c,"cs_",(GLchar *)0x0,"color",
               (GLchar *)0x0,"sampler",&local_1f8);
  }
  else {
    getShadowSamplingFunctionCall
              (this_00,sampling_function_00,local_200,local_23c,"cs_",(GLchar *)0x0,"color",
               (GLchar *)0x0,"sampler",&local_1f8);
  }
  poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),
                           "${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp float;\n");
  poVar1 = std::operator<<(poVar1,"/* Sampling compute shader */");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"uniform ");
  poVar1 = std::operator<<(poVar1,"highp ");
  poVar1 = std::operator<<(poVar1,local_230);
  poVar1 = std::operator<<(poVar1,"sampler");
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"layout(");
  poVar1 = std::operator<<(poVar1,local_228);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"uniform ");
  poVar1 = std::operator<<(poVar1,"writeonly ");
  poVar1 = std::operator<<(poVar1,"highp ");
  poVar1 = std::operator<<(poVar1,local_220);
  poVar1 = std::operator<<(poVar1,"image");
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar3 = lVar9;
  puVar7 = puVar6;
  while (bVar10 = lVar3 != 0, lVar3 = lVar3 + -1, bVar10) {
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"layout(std430, binding=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)puVar7 + 0x14));
    poVar1 = std::operator<<(poVar1,") buffer ");
    poVar1 = std::operator<<(poVar1,(char *)*puVar7);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)(local_1d8 + 0x10),"{\n");
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"    ");
    poVar1 = std::operator<<(poVar1,(char *)puVar7[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(char *)*puVar7);
    std::operator<<(poVar1,"_data[];\n");
    std::operator<<((ostream *)(local_1d8 + 0x10),"};\n");
    puVar7 = puVar7 + 3;
  }
  lVar8 = (ulong)(local_240 == Depth) * 0x18;
  for (lVar3 = 0; lVar8 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"layout(std430, binding=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&paVar5->binding + lVar3));
    poVar1 = std::operator<<(poVar1,") buffer ");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->name + lVar3));
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)(local_1d8 + 0x10),"{\n");
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"    ");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->type + lVar3));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->name + lVar3));
    std::operator<<(poVar1,"_data[];\n");
    std::operator<<((ostream *)(local_1d8 + 0x10),"};\n");
  }
  poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)(local_1d8 + 0x10),
                  "void main()\n{\n    const int face_width         = 3;\n    const int face_height        = 3;\n    const int vertices_per_face  = face_width * face_height;\n    const int faces_per_layer    = 6;\n    const int layer_width        = faces_per_layer * face_width;\n    const int vertices_per_layer = vertices_per_face * faces_per_layer;\n\n    ivec2 image_coord            = ivec2(gl_WorkGroupID.xy);\n    ivec3 texture_size           = textureSize(sampler, 0);\n\n    int layer                    = image_coord.x / layer_width;\n    int layer_offset             = layer * layer_width;\n    int layer_index              = layer * vertices_per_layer;\n    int face                     = (image_coord.x - layer_offset) / face_width;\n    int face_offset              = face * face_width;\n    int face_index               = face * vertices_per_face;\n    int vertex                   = image_coord.x - layer_offset - face_offset;\n    int vertex_index             = layer_index + face_index + vertex + (face_height - image_coord.y - 1) * face_width;\n\n"
                 );
  while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"    ");
    poVar1 = std::operator<<(poVar1,(char *)puVar6[1]);
    poVar1 = std::operator<<(poVar1,"cs_");
    poVar1 = std::operator<<(poVar1,(char *)*puVar6);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,(char *)*puVar6);
    poVar1 = std::operator<<(poVar1,"_data[vertex_index];");
    std::endl<char,std::char_traits<char>>(poVar1);
    puVar6 = puVar6 + 3;
  }
  for (lVar9 = 0; lVar8 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
    poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"    ");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->type + lVar9));
    poVar1 = std::operator<<(poVar1,"cs_");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->name + lVar9));
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,*(char **)((long)&paVar5->name + lVar9));
    poVar1 = std::operator<<(poVar1,"_data[vertex_index];");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)(local_1d8 + 0x10));
  poVar1 = std::operator<<(poVar1,"    ");
  poVar1 = std::operator<<(poVar1,local_210);
  pcVar4 = "color";
  poVar1 = std::operator<<(poVar1,"color");
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)(local_1d8 + 0x10));
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)(local_1d8 + 0x10),"    imageStore(image, image_coord, ");
  poVar1 = (ostream *)(local_1d8 + 0x10);
  if (local_244 != 4) {
    if (local_244 != 1) goto LAB_00d3d60a;
    if (*local_238 == Depth) {
      pcVar4 = "vec4(";
    }
    else {
      if (*local_238 != Stencil) goto LAB_00d3d60a;
      pcVar4 = "uvec4(";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    poVar1 = std::operator<<(poVar1,"color");
    pcVar4 = ")";
  }
  std::operator<<(poVar1,pcVar4);
LAB_00d3d60a:
  std::operator<<((ostream *)(local_1d8 + 0x10),");\n");
  poVar1 = std::operator<<((ostream *)(local_1d8 + 0x10),"}\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_218,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode(const samplerType&	  sampler_type,
																   const samplingFunction& sampling_function,
																   std::string&			   out_compute_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   image_type_str				 = 0;
	const glw::GLchar*		   image_layout_str				 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, image_type_str, image_layout_str,
				 n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
								compute_shader_color, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
									  compute_shader_color, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling compute shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	/* uniform writeonly image2D image*/
	stream << "layout(" << image_layout_str << ") " << shader_uniform << shader_writeonly << "highp " << image_type_str
		   << image_name << ";" << std::endl;

	/* layout(shared) buffer attribute { type attribute_data[]; }; */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << compute_shader_layout_binding << routine_attribute_definitions[i].binding << compute_shader_buffer
			   << routine_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << routine_attribute_definitions[i].type << " " << routine_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << compute_shader_layout_binding << type_attribute_definitions[i].binding << compute_shader_buffer
			   << type_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << type_attribute_definitions[i].type << " " << type_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}

	/* layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in; */
	stream << compute_shader_layout << std::endl;

	/* main + body */
	stream << compute_shader_body;

	/* type cs_attribute = attribute_data[vertex_index] */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << "    " << routine_attribute_definitions[i].type << compute_shader_param
			   << routine_attribute_definitions[i].name << " = " << routine_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << "    " << type_attribute_definitions[i].type << compute_shader_param
			   << type_attribute_definitions[i].name << " = " << type_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}

	/* type color */
	stream << std::endl << "    " << color_type << compute_shader_color << ";" << std::endl;

	/* color = texture*/
	stream << std::endl << sampling_code << std::endl;
	//stream << std::endl << compute_shader_color << " = vec4(cs_grad_x, 255.0);" << std::endl;

	/* imageStore */
	stream << compute_shader_image_store;
	switch (n_components)
	{
	case 1:
		/* imageStore(image, image_coord, color.r);*/
		if (sampler_type == Depth)
		{
			stream << "vec4(" << compute_shader_color << ")";
		}
		else if (sampler_type == Stencil)
		{
			stream << "uvec4(" << compute_shader_color << ")";
		}
		else
		{
			// unexpected case
			DE_ASSERT(false);
		}
		break;
	case 4:
		/* imageStore(image, image_coord, color);*/
		stream << compute_shader_color;
		break;
	};

	stream << ");\n";

	stream << "}\n" << std::endl;

	out_compute_shader_code = stream.str();
}